

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_render.cpp
# Opt level: O0

void __thiscall OpacityTextures::check(OpacityTextures *this)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  ostream *poVar4;
  char *pcVar5;
  rect2d rVar6;
  vec4 local_b58;
  vec4 local_b48;
  vec4 local_b38;
  vec4 local_b28;
  vec4 local_b18;
  vec4 local_b08;
  vec4 local_af8;
  vec4 local_ae8;
  vec4 local_ad8;
  vec4 local_ac8;
  vec4 local_ab8;
  vec4 local_aa8;
  vec4 local_a98;
  vec4 local_a88;
  vec4 local_a78;
  vec4 local_a68;
  vec4 local_a58;
  vec4 local_a48;
  vec4 local_a38;
  vec4 local_a28;
  vec4 local_a18;
  vec4 local_a08;
  vec4 local_9f8;
  vec4 local_9e8;
  vec4 local_9d8;
  vec4 local_9c8;
  vec4 local_9b8;
  vec4 local_9a8;
  float local_998;
  float y_2;
  vec4 vStack_994;
  vec4 local_984;
  vec4 local_974;
  vec4 local_964;
  vec4 local_954;
  vec4 local_944;
  vec4 local_934;
  vec4 local_924;
  float local_914;
  float x_2;
  vec4 vStack_910;
  vec4 local_900;
  vec4 local_8f0;
  vec4 local_8e0;
  vec4 local_8d0;
  vec4 local_8c0;
  vec4 local_8b0;
  vec4 local_8a0;
  vec4 local_890;
  vec4 local_880;
  vec4 local_870;
  vec4 local_860;
  vec4 local_850;
  vec4 local_840;
  vec4 local_830;
  vec4 local_820;
  rect2d local_810;
  float local_800;
  vec2 vStack_7fc;
  float y2_2;
  vec2 local_7f4;
  float local_7ec;
  vec2 vStack_7e8;
  float y1_2;
  vec2 local_7e0;
  float local_7d8;
  float fStack_7d4;
  float x2_2;
  vec2 local_7cc;
  float local_7c4;
  float x1_2;
  vec4 vStack_7c0;
  vec4 local_7b0;
  vec4 local_7a0;
  vec4 local_790;
  vec4 local_780;
  vec4 local_770;
  vec4 local_760;
  vec4 local_750;
  vec4 local_740;
  vec4 local_730;
  vec4 local_720;
  vec4 local_710;
  vec4 local_700;
  vec4 local_6f0;
  vec4 local_6e0;
  vec4 local_6d0;
  vec4 local_6c0;
  vec4 local_6b0;
  vec4 local_6a0;
  vec4 local_690;
  vec4 local_680;
  vec4 local_670;
  vec4 local_660;
  vec4 local_650;
  vec4 local_640;
  vec4 local_630;
  vec4 local_620;
  vec4 local_610;
  vec4 local_600;
  vec4 local_5f0;
  vec4 local_5e0;
  vec4 local_5d0;
  float local_5c0;
  float y_1;
  vec4 vStack_5bc;
  vec4 local_5ac;
  vec4 local_59c;
  vec4 local_58c;
  vec4 local_57c;
  vec4 local_56c;
  vec4 local_55c;
  vec4 local_54c;
  float local_53c;
  float x_1;
  vec4 vStack_538;
  vec4 local_528;
  vec4 local_518;
  vec4 local_508;
  vec4 local_4f8;
  vec4 local_4e8;
  vec4 local_4d8;
  vec4 local_4c8;
  vec4 local_4b8;
  vec4 local_4a8;
  vec4 local_498;
  vec4 local_488;
  vec4 local_478;
  vec4 local_468;
  vec4 local_458;
  vec4 local_448;
  rect2d local_438;
  float local_428;
  vec2 vStack_424;
  float y2_1;
  vec2 local_41c;
  float local_414;
  vec2 vStack_410;
  float y1_1;
  vec2 local_408;
  float local_400;
  float fStack_3fc;
  float x2_1;
  vec2 local_3f4;
  float local_3ec;
  float x1_1;
  vec4 vStack_3e8;
  vec4 local_3d8;
  vec4 local_3c8;
  vec4 local_3b8;
  vec4 local_3a8;
  vec4 local_398;
  vec4 local_388;
  vec4 local_378;
  vec4 local_368;
  vec4 local_358;
  vec4 local_348;
  vec4 local_338;
  vec4 local_328;
  vec4 local_318;
  vec4 local_308;
  vec4 local_2f8;
  vec4 local_2e8;
  vec4 local_2d8;
  vec4 local_2c8;
  vec4 local_2b8;
  vec4 local_2a8;
  vec4 local_298;
  vec4 local_288;
  vec4 local_278;
  vec4 local_268;
  vec4 local_258;
  vec4 local_248;
  vec4 local_238;
  vec4 local_228;
  vec4 local_218;
  vec4 local_208;
  vec4 local_1f8;
  float local_1e8;
  float y;
  vec4 vStack_1e4;
  vec4 local_1d4;
  vec4 local_1c4;
  vec4 local_1b4;
  vec4 local_1a4;
  vec4 local_194;
  vec4 local_184;
  vec4 local_174;
  float local_164;
  float x;
  vec4 vStack_160;
  vec4 local_150;
  vec4 local_140;
  vec4 local_130;
  vec4 local_120;
  vec4 local_110;
  vec4 local_100;
  vec4 local_f0;
  vec4 local_e0;
  vec4 local_d0;
  vec4 local_c0;
  vec4 local_b0;
  vec4 local_a0;
  vec4 local_90;
  vec4 local_80;
  vec4 local_70;
  rect2d local_60;
  float local_50;
  vec2 vStack_4c;
  float y2;
  vec2 local_44;
  float local_3c;
  vec2 vStack_38;
  float y1;
  vec2 local_30;
  float local_28;
  float fStack_24;
  float x2;
  vec2 local_1c;
  float local_14;
  OpacityTextures *pOStack_10;
  float x1;
  OpacityTextures *this_local;
  
  pOStack_10 = this;
  rVar6 = rengine::rect2d::fromXywh(10.0,10.0,11.0,11.0);
  local_1c = rVar6.br;
  fStack_24 = rVar6.tl.x;
  local_14 = fStack_24;
  _fStack_24 = rVar6.tl;
  rVar6 = rengine::rect2d::fromXywh(10.0,10.0,11.0,11.0);
  vStack_38 = rVar6.tl;
  local_30.x = rVar6.br.x;
  local_28 = local_30.x + -1.0;
  local_30 = rVar6.br;
  rVar6 = rengine::rect2d::fromXywh(10.0,10.0,11.0,11.0);
  local_44 = rVar6.br;
  y2 = rVar6.tl.y;
  local_3c = y2;
  vStack_4c = rVar6.tl;
  local_60 = rengine::rect2d::fromXywh(10.0,10.0,11.0,11.0);
  local_50 = local_60.br.y - 1.0;
  if (local_14 - 1.0 < 0.0) {
    __assert_fail("x1-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_w <= local_14 - 1.0) {
    __assert_fail("x1-1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if (local_3c - 1.0 < 0.0) {
    __assert_fail("y1-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_h <= local_3c - 1.0) {
    __assert_fail("y1-1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  local_70 = rengine::StaticRenderTest::pixel
                       (&this->super_StaticRenderTest,(int)(local_14 - 1.0),(int)(local_3c - 1.0));
  rengine::vec4::vec4(&local_80,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_70,local_80,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_14 - 1.0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3c - 1.0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(uint)(int)(local_14 - 1.0);
    local_90 = rengine::StaticRenderTest::pixel
                         (&this->super_StaticRenderTest,(int)(local_14 - 1.0),(int)(local_3c - 1.0))
    ;
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_90);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_a0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_a0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if (local_28 + 1.0 < 0.0) {
    __assert_fail("x2+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_w <= local_28 + 1.0) {
    __assert_fail("x2+1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if (local_3c - 1.0 < 0.0) {
    __assert_fail("y1-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_h <= local_3c - 1.0) {
    __assert_fail("y1-1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  local_b0 = rengine::StaticRenderTest::pixel
                       (&this->super_StaticRenderTest,(int)(local_28 + 1.0),(int)(local_3c - 1.0));
  rengine::vec4::vec4(&local_c0,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_b0,local_c0,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_28 + 1.0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3c - 1.0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(uint)(int)(local_28 + 1.0);
    local_d0 = rengine::StaticRenderTest::pixel
                         (&this->super_StaticRenderTest,(int)(local_28 + 1.0),(int)(local_3c - 1.0))
    ;
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_d0);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_e0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if (local_14 - 1.0 < 0.0) {
    __assert_fail("x1-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_w <= local_14 - 1.0) {
    __assert_fail("x1-1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if (local_50 + 1.0 < 0.0) {
    __assert_fail("y2+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_h <= local_50 + 1.0) {
    __assert_fail("y2+1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  local_f0 = rengine::StaticRenderTest::pixel
                       (&this->super_StaticRenderTest,(int)(local_14 - 1.0),(int)(local_50 + 1.0));
  rengine::vec4::vec4(&local_100,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_f0,local_100,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_14 - 1.0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_50 + 1.0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(uint)(int)(local_14 - 1.0);
    local_110 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_14 - 1.0),(int)(local_50 + 1.0)
                          );
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_110);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_120,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_120);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if (local_28 + 1.0 < 0.0) {
    __assert_fail("x2+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_w <= local_28 + 1.0) {
    __assert_fail("x2+1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if (local_50 + 1.0 < 0.0) {
    __assert_fail("y2+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_h <= local_50 + 1.0) {
    __assert_fail("y2+1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  local_130 = rengine::StaticRenderTest::pixel
                        (&this->super_StaticRenderTest,(int)(local_28 + 1.0),(int)(local_50 + 1.0));
  rengine::vec4::vec4(&local_140,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_130,local_140,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_28 + 1.0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_50 + 1.0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(uint)(int)(local_28 + 1.0);
    local_150 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_28 + 1.0),(int)(local_50 + 1.0)
                          );
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_150);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&stack0xfffffffffffffea0,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,vStack_160);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbb,"virtual void OpacityTextures::check()");
  }
  for (local_164 = local_14; local_164 <= local_28; local_164 = local_164 + 1.0) {
    if (local_164 < 0.0) {
      __assert_fail("x >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_164) {
      __assert_fail("x < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if (local_3c - 1.0 < 0.0) {
      __assert_fail("y1-1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_3c - 1.0) {
      __assert_fail("y1-1 < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    local_174 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)local_164,(int)(local_3c - 1.0));
    rengine::vec4::vec4(&local_184,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_174,local_184,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_164);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_3c - 1.0);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)local_164;
      local_194 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)local_164,(int)(local_3c - 1.0));
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_194);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&local_1a4,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_1a4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if (local_164 < 0.0) {
      __assert_fail("x >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_164) {
      __assert_fail("x < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if (local_50 + 1.0 < 0.0) {
      __assert_fail("y2+1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_50 + 1.0) {
      __assert_fail("y2+1 < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    local_1b4 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)local_164,(int)(local_50 + 1.0));
    rengine::vec4::vec4(&local_1c4,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_1b4,local_1c4,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_164);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_50 + 1.0);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)local_164;
      local_1d4 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)local_164,(int)(local_50 + 1.0));
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_1d4);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&stack0xfffffffffffffe1c,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,vStack_1e4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
  }
  for (local_1e8 = local_3c; local_1e8 <= local_50; local_1e8 = local_1e8 + 1.0) {
    if (local_14 - 1.0 < 0.0) {
      __assert_fail("x1-1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_14 - 1.0) {
      __assert_fail("x1-1 < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if (local_1e8 < 0.0) {
      __assert_fail("y >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_1e8) {
      __assert_fail("y < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    local_1f8 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_14 - 1.0),(int)local_1e8);
    rengine::vec4::vec4(&local_208,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_1f8,local_208,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_14 - 1.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1e8);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)(local_14 - 1.0);
      local_218 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)(local_14 - 1.0),(int)local_1e8);
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_218);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&local_228,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_228);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if (local_28 + 1.0 < 0.0) {
      __assert_fail("x2+1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_28 + 1.0) {
      __assert_fail("x2+1 < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if (local_1e8 < 0.0) {
      __assert_fail("y >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_1e8) {
      __assert_fail("y < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
    local_238 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_28 + 1.0),(int)local_1e8);
    rengine::vec4::vec4(&local_248,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_238,local_248,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_28 + 1.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1e8);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)(local_28 + 1.0);
      local_258 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)(local_28 + 1.0),(int)local_1e8);
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_258);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&local_268,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_268);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xbb,"virtual void OpacityTextures::check()");
    }
  }
  if ((this->super_StaticRenderTest).m_w < 0xb) {
    __assert_fail("10 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbc,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xb) {
    __assert_fail("10 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbc,"virtual void OpacityTextures::check()");
  }
  local_278 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,10);
  rengine::vec4::vec4(&local_288,0.5,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_278,local_288,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,10);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xa;
    local_298 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,10);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_298);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_2a8,0.5,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_2a8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbc,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 0xc) {
    __assert_fail("11 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbd,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xb) {
    __assert_fail("10 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbd,"virtual void OpacityTextures::check()");
  }
  local_2b8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,10);
  rengine::vec4::vec4(&local_2c8,0.5,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_2b8,local_2c8,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0xb);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xb;
    local_2d8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,10);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_2d8);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_2e8,0.5,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_2e8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbd,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 0xb) {
    __assert_fail("10 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbe,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    __assert_fail("11 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbe,"virtual void OpacityTextures::check()");
  }
  local_2f8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,0xb);
  rengine::vec4::vec4(&local_308,0.5,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_2f8,local_308,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,10);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xa;
    local_318 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_318);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_328,0.5,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_328);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbe,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 0xc) {
    __assert_fail("11 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbf,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    __assert_fail("11 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbf,"virtual void OpacityTextures::check()");
  }
  local_338 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xb);
  rengine::vec4::vec4(&local_348,0.0,0.0,0.5,1.0);
  bVar1 = rengine::fuzzy_equals(local_338,local_348,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0xb);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xb;
    local_358 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_358);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_368,0.0,0.0,0.5,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_368);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbf,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 0xc) {
    __assert_fail("11 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc0,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    __assert_fail("12 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc0,"virtual void OpacityTextures::check()");
  }
  local_378 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xc);
  rengine::vec4::vec4(&local_388,0.0,0.0,0.5,1.0);
  bVar1 = rengine::fuzzy_equals(local_378,local_388,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0xb);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xb;
    local_398 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xc);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_398);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_3a8,0.0,0.0,0.5,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_3a8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc0,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 0xd) {
    __assert_fail("12 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc1,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    __assert_fail("11 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc1,"virtual void OpacityTextures::check()");
  }
  local_3b8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xc,0xb);
  rengine::vec4::vec4(&local_3c8,0.0,0.0,0.5,1.0);
  bVar1 = rengine::fuzzy_equals(local_3b8,local_3c8,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0xc);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0xc;
    local_3d8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xc,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_3d8);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&stack0xfffffffffffffc18,0.0,0.0,0.5,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,vStack_3e8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc1,"virtual void OpacityTextures::check()");
  }
  rVar6 = rengine::rect2d::fromXywh(31.0,11.0,11.0,11.0);
  local_3f4 = rVar6.br;
  fStack_3fc = rVar6.tl.x;
  local_3ec = fStack_3fc;
  _fStack_3fc = rVar6.tl;
  rVar6 = rengine::rect2d::fromXywh(31.0,11.0,11.0,11.0);
  vStack_410 = rVar6.tl;
  local_408.x = rVar6.br.x;
  local_400 = local_408.x + -1.0;
  local_408 = rVar6.br;
  rVar6 = rengine::rect2d::fromXywh(31.0,11.0,11.0,11.0);
  local_41c = rVar6.br;
  y2_1 = rVar6.tl.y;
  local_414 = y2_1;
  vStack_424 = rVar6.tl;
  local_438 = rengine::rect2d::fromXywh(31.0,11.0,11.0,11.0);
  local_428 = local_438.br.y - 1.0;
  if (local_3ec - 1.0 < 0.0) {
    __assert_fail("x1-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_w <= local_3ec - 1.0) {
    __assert_fail("x1-1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if (local_414 - 1.0 < 0.0) {
    __assert_fail("y1-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_h <= local_414 - 1.0) {
    __assert_fail("y1-1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  local_448 = rengine::StaticRenderTest::pixel
                        (&this->super_StaticRenderTest,(int)(local_3ec - 1.0),(int)(local_414 - 1.0)
                        );
  rengine::vec4::vec4(&local_458,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_448,local_458,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_3ec - 1.0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_414 - 1.0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(uint)(int)(local_3ec - 1.0);
    local_468 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_3ec - 1.0),
                           (int)(local_414 - 1.0));
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_468);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_478,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_478);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if (local_400 + 1.0 < 0.0) {
    __assert_fail("x2+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_w <= local_400 + 1.0) {
    __assert_fail("x2+1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if (local_414 - 1.0 < 0.0) {
    __assert_fail("y1-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_h <= local_414 - 1.0) {
    __assert_fail("y1-1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  local_488 = rengine::StaticRenderTest::pixel
                        (&this->super_StaticRenderTest,(int)(local_400 + 1.0),(int)(local_414 - 1.0)
                        );
  rengine::vec4::vec4(&local_498,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_488,local_498,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_400 + 1.0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_414 - 1.0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(uint)(int)(local_400 + 1.0);
    local_4a8 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_400 + 1.0),
                           (int)(local_414 - 1.0));
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_4a8);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_4b8,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_4b8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if (local_3ec - 1.0 < 0.0) {
    __assert_fail("x1-1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_w <= local_3ec - 1.0) {
    __assert_fail("x1-1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if (local_428 + 1.0 < 0.0) {
    __assert_fail("y2+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_h <= local_428 + 1.0) {
    __assert_fail("y2+1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  local_4c8 = rengine::StaticRenderTest::pixel
                        (&this->super_StaticRenderTest,(int)(local_3ec - 1.0),(int)(local_428 + 1.0)
                        );
  rengine::vec4::vec4(&local_4d8,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_4c8,local_4d8,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_3ec - 1.0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_428 + 1.0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(uint)(int)(local_3ec - 1.0);
    local_4e8 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_3ec - 1.0),
                           (int)(local_428 + 1.0));
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_4e8);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_4f8,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_4f8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if (local_400 + 1.0 < 0.0) {
    __assert_fail("x2+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_w <= local_400 + 1.0) {
    __assert_fail("x2+1 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if (local_428 + 1.0 < 0.0) {
    __assert_fail("y2+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  if ((float)(this->super_StaticRenderTest).m_h <= local_428 + 1.0) {
    __assert_fail("y2+1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  local_508 = rengine::StaticRenderTest::pixel
                        (&this->super_StaticRenderTest,(int)(local_400 + 1.0),(int)(local_428 + 1.0)
                        );
  rengine::vec4::vec4(&local_518,0.0,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_508,local_518,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_400 + 1.0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_428 + 1.0);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)(ulong)(uint)(int)(local_400 + 1.0);
    local_528 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_400 + 1.0),
                           (int)(local_428 + 1.0));
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_528);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&stack0xfffffffffffffac8,0.0,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,vStack_538);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc3,"virtual void OpacityTextures::check()");
  }
  for (local_53c = local_3ec; local_53c <= local_400; local_53c = local_53c + 1.0) {
    if (local_53c < 0.0) {
      __assert_fail("x >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_53c) {
      __assert_fail("x < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if (local_414 - 1.0 < 0.0) {
      __assert_fail("y1-1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_414 - 1.0) {
      __assert_fail("y1-1 < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    local_54c = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)local_53c,(int)(local_414 - 1.0));
    rengine::vec4::vec4(&local_55c,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_54c,local_55c,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_53c);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_414 - 1.0);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)local_53c;
      local_56c = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)local_53c,(int)(local_414 - 1.0));
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_56c);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&local_57c,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_57c);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if (local_53c < 0.0) {
      __assert_fail("x >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_53c) {
      __assert_fail("x < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if (local_428 + 1.0 < 0.0) {
      __assert_fail("y2+1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_428 + 1.0) {
      __assert_fail("y2+1 < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    local_58c = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)local_53c,(int)(local_428 + 1.0));
    rengine::vec4::vec4(&local_59c,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_58c,local_59c,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_53c);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_428 + 1.0);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)local_53c;
      local_5ac = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)local_53c,(int)(local_428 + 1.0));
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_5ac);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&stack0xfffffffffffffa44,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,vStack_5bc);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
  }
  for (local_5c0 = local_414; local_5c0 <= local_428; local_5c0 = local_5c0 + 1.0) {
    if (local_3ec - 1.0 < 0.0) {
      __assert_fail("x1-1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_3ec - 1.0) {
      __assert_fail("x1-1 < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if (local_5c0 < 0.0) {
      __assert_fail("y >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_5c0) {
      __assert_fail("y < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    local_5d0 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_3ec - 1.0),(int)local_5c0);
    rengine::vec4::vec4(&local_5e0,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_5d0,local_5e0,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_3ec - 1.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c0);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)(local_3ec - 1.0);
      local_5f0 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)(local_3ec - 1.0),(int)local_5c0);
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_5f0);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&local_600,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_600);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if (local_400 + 1.0 < 0.0) {
      __assert_fail("x2+1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_400 + 1.0) {
      __assert_fail("x2+1 < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if (local_5c0 < 0.0) {
      __assert_fail("y >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_5c0) {
      __assert_fail("y < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
    local_610 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_400 + 1.0),(int)local_5c0);
    rengine::vec4::vec4(&local_620,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_610,local_620,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_400 + 1.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c0);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)(local_400 + 1.0);
      local_630 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)(local_400 + 1.0),(int)local_5c0);
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_630);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&local_640,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_640);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc3,"virtual void OpacityTextures::check()");
    }
  }
  if ((this->super_StaticRenderTest).m_w < 0x20) {
    __assert_fail("31 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc4,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    __assert_fail("11 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc4,"virtual void OpacityTextures::check()");
  }
  local_650 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xb);
  rengine::vec4::vec4(&local_660,0.0,0.5,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_650,local_660,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x1f);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x1f;
    local_670 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_670);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_680,0.0,0.5,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_680);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc4,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 0x21) {
    __assert_fail("32 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc5,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    __assert_fail("11 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc5,"virtual void OpacityTextures::check()");
  }
  local_690 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xb);
  rengine::vec4::vec4(&local_6a0,0.0,0.5,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_690,local_6a0,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x20);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x20;
    local_6b0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xb);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_6b0);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_6c0,0.0,0.5,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_6c0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc5,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 0x20) {
    __assert_fail("31 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc6,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    __assert_fail("12 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc6,"virtual void OpacityTextures::check()");
  }
  local_6d0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xc);
  rengine::vec4::vec4(&local_6e0,0.0,0.5,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_6d0,local_6e0,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x1f);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x1f;
    local_6f0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xc);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_6f0);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_700,0.0,0.5,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_700);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc6,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 0x21) {
    __assert_fail("32 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,199,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    __assert_fail("12 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,199,"virtual void OpacityTextures::check()");
  }
  local_710 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xc);
  rengine::vec4::vec4(&local_720,0.5,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_710,local_720,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x20);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x20;
    local_730 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xc);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_730);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_740,0.5,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_740);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,199,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_w < 0x22) {
    __assert_fail("33 < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,200,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    __assert_fail("12 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,200,"virtual void OpacityTextures::check()");
  }
  local_750 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x21,0xc);
  rengine::vec4::vec4(&local_760,0.5,0.0,0.0,1.0);
  bVar1 = rengine::fuzzy_equals(local_750,local_760,0.01);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x21);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xc);
    poVar2 = std::operator<<(poVar2,")=");
    poVar4 = (ostream *)0x21;
    local_770 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x21,0xc);
    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_770);
    pcVar5 = "; expected=";
    poVar2 = std::operator<<(poVar2,"; expected=");
    rengine::vec4::vec4(&local_780,0.5,0.0,0.0,1.0);
    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_780);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,200,"virtual void OpacityTextures::check()");
  }
  if (0x20 < (this->super_StaticRenderTest).m_w) {
    if ((this->super_StaticRenderTest).m_h < 0xe) {
      __assert_fail("13 < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc9,"virtual void OpacityTextures::check()");
    }
    local_790 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xd);
    rengine::vec4::vec4(&local_7a0,0.5,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_790,local_7a0,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x20);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)0x20;
      local_7b0 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xd);
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_7b0);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&stack0xfffffffffffff840,0.5,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,vStack_7c0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xc9,"virtual void OpacityTextures::check()");
    }
    rVar6 = rengine::rect2d::fromXywh(100.0,10.0,11.0,11.0);
    local_7cc = rVar6.br;
    fStack_7d4 = rVar6.tl.x;
    local_7c4 = fStack_7d4;
    _fStack_7d4 = rVar6.tl;
    rVar6 = rengine::rect2d::fromXywh(100.0,10.0,11.0,11.0);
    vStack_7e8 = rVar6.tl;
    local_7e0.x = rVar6.br.x;
    local_7d8 = local_7e0.x + -1.0;
    local_7e0 = rVar6.br;
    rVar6 = rengine::rect2d::fromXywh(100.0,10.0,11.0,11.0);
    local_7f4 = rVar6.br;
    y2_2 = rVar6.tl.y;
    local_7ec = y2_2;
    vStack_7fc = rVar6.tl;
    local_810 = rengine::rect2d::fromXywh(100.0,10.0,11.0,11.0);
    local_800 = local_810.br.y - 1.0;
    if (local_7c4 - 1.0 < 0.0) {
      __assert_fail("x1-1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_7c4 - 1.0) {
      __assert_fail("x1-1 < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if (local_7ec - 1.0 < 0.0) {
      __assert_fail("y1-1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_7ec - 1.0) {
      __assert_fail("y1-1 < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    local_820 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_7c4 - 1.0),
                           (int)(local_7ec - 1.0));
    rengine::vec4::vec4(&local_830,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_820,local_830,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_7c4 - 1.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7ec - 1.0);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)(local_7c4 - 1.0);
      local_840 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)(local_7c4 - 1.0),
                             (int)(local_7ec - 1.0));
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_840);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&local_850,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_850);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if (local_7d8 + 1.0 < 0.0) {
      __assert_fail("x2+1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_7d8 + 1.0) {
      __assert_fail("x2+1 < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if (local_7ec - 1.0 < 0.0) {
      __assert_fail("y1-1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_h <= local_7ec - 1.0) {
      __assert_fail("y1-1 < m_h",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    local_860 = rengine::StaticRenderTest::pixel
                          (&this->super_StaticRenderTest,(int)(local_7d8 + 1.0),
                           (int)(local_7ec - 1.0));
    rengine::vec4::vec4(&local_870,0.0,0.0,0.0,1.0);
    bVar1 = rengine::fuzzy_equals(local_860,local_870,0.01);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_7d8 + 1.0);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7ec - 1.0);
      poVar2 = std::operator<<(poVar2,")=");
      poVar4 = (ostream *)(ulong)(uint)(int)(local_7d8 + 1.0);
      local_880 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)(local_7d8 + 1.0),
                             (int)(local_7ec - 1.0));
      poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_880);
      pcVar5 = "; expected=";
      poVar2 = std::operator<<(poVar2,"; expected=");
      rengine::vec4::vec4(&local_890,0.0,0.0,0.0,1.0);
      poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_890);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if (local_7c4 - 1.0 < 0.0) {
      __assert_fail("x1-1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if ((float)(this->super_StaticRenderTest).m_w <= local_7c4 - 1.0) {
      __assert_fail("x1-1 < m_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if (local_800 + 1.0 < 0.0) {
      __assert_fail("y2+1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    if (local_800 + 1.0 < (float)(this->super_StaticRenderTest).m_h) {
      local_8a0 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)(local_7c4 - 1.0),
                             (int)(local_800 + 1.0));
      rengine::vec4::vec4(&local_8b0,0.0,0.0,0.0,1.0);
      bVar1 = rengine::fuzzy_equals(local_8a0,local_8b0,0.01);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
        poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_7c4 - 1.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_800 + 1.0);
        poVar2 = std::operator<<(poVar2,")=");
        poVar4 = (ostream *)(ulong)(uint)(int)(local_7c4 - 1.0);
        local_8c0 = rengine::StaticRenderTest::pixel
                              (&this->super_StaticRenderTest,(int)(local_7c4 - 1.0),
                               (int)(local_800 + 1.0));
        poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_8c0);
        pcVar5 = "; expected=";
        poVar2 = std::operator<<(poVar2,"; expected=");
        rengine::vec4::vec4(&local_8d0,0.0,0.0,0.0,1.0);
        poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_8d0);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                      ,0xcb,"virtual void OpacityTextures::check()");
      }
      if (local_7d8 + 1.0 < 0.0) {
        __assert_fail("x2+1 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                      ,0xcb,"virtual void OpacityTextures::check()");
      }
      if ((float)(this->super_StaticRenderTest).m_w <= local_7d8 + 1.0) {
        __assert_fail("x2+1 < m_w",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                      ,0xcb,"virtual void OpacityTextures::check()");
      }
      if (local_800 + 1.0 < 0.0) {
        __assert_fail("y2+1 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                      ,0xcb,"virtual void OpacityTextures::check()");
      }
      if ((float)(this->super_StaticRenderTest).m_h <= local_800 + 1.0) {
        __assert_fail("y2+1 < m_h",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                      ,0xcb,"virtual void OpacityTextures::check()");
      }
      local_8e0 = rengine::StaticRenderTest::pixel
                            (&this->super_StaticRenderTest,(int)(local_7d8 + 1.0),
                             (int)(local_800 + 1.0));
      rengine::vec4::vec4(&local_8f0,0.0,0.0,0.0,1.0);
      bVar1 = rengine::fuzzy_equals(local_8e0,local_8f0,0.01);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
        poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_7d8 + 1.0);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_800 + 1.0);
        poVar2 = std::operator<<(poVar2,")=");
        poVar4 = (ostream *)(ulong)(uint)(int)(local_7d8 + 1.0);
        local_900 = rengine::StaticRenderTest::pixel
                              (&this->super_StaticRenderTest,(int)(local_7d8 + 1.0),
                               (int)(local_800 + 1.0));
        poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_900);
        pcVar5 = "; expected=";
        poVar2 = std::operator<<(poVar2,"; expected=");
        rengine::vec4::vec4(&stack0xfffffffffffff6f0,0.0,0.0,0.0,1.0);
        poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,vStack_910);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                      ,0xcb,"virtual void OpacityTextures::check()");
      }
      local_914 = local_7c4;
      while( true ) {
        if (local_7d8 < local_914) {
          local_998 = local_7ec;
          while( true ) {
            if (local_800 < local_998) {
              if ((this->super_StaticRenderTest).m_w < 0x65) {
                __assert_fail("100 < m_w",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                              ,0xcc,"virtual void OpacityTextures::check()");
              }
              if ((this->super_StaticRenderTest).m_h < 0xb) {
                __assert_fail("10 < m_h",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                              ,0xcc,"virtual void OpacityTextures::check()");
              }
              local_a28 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,100,10);
              rengine::vec4::vec4(&local_a38,0.64,0.0,0.0,1.0);
              bVar1 = rengine::fuzzy_equals(local_a28,local_a38,0.01);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
                poVar2 = (ostream *)std::ostream::operator<<(pvVar3,100);
                poVar2 = std::operator<<(poVar2,",");
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
                poVar2 = std::operator<<(poVar2,")=");
                poVar4 = (ostream *)0x64;
                local_a48 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,100,10);
                poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_a48);
                pcVar5 = "; expected=";
                poVar2 = std::operator<<(poVar2,"; expected=");
                rengine::vec4::vec4(&local_a58,0.64,0.0,0.0,1.0);
                poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_a58);
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                              ,0xcc,"virtual void OpacityTextures::check()");
              }
              if ((this->super_StaticRenderTest).m_w < 0x66) {
                __assert_fail("101 < m_w",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                              ,0xcd,"virtual void OpacityTextures::check()");
              }
              if ((this->super_StaticRenderTest).m_h < 0xc) {
                __assert_fail("11 < m_h",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                              ,0xcd,"virtual void OpacityTextures::check()");
              }
              local_a68 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x65,0xb);
              rengine::vec4::vec4(&local_a78,0.0,0.0,0.64,1.0);
              bVar1 = rengine::fuzzy_equals(local_a68,local_a78,0.01);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
                poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x65);
                poVar2 = std::operator<<(poVar2,",");
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xb);
                poVar2 = std::operator<<(poVar2,")=");
                poVar4 = (ostream *)0x65;
                local_a88 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x65,0xb)
                ;
                poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_a88);
                pcVar5 = "; expected=";
                poVar2 = std::operator<<(poVar2,"; expected=");
                rengine::vec4::vec4(&local_a98,0.0,0.0,0.64,1.0);
                poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_a98);
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                              ,0xcd,"virtual void OpacityTextures::check()");
              }
              if ((this->super_StaticRenderTest).m_w < 0x6f) {
                __assert_fail("110 < m_w",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                              ,0xce,"virtual void OpacityTextures::check()");
              }
              if (0x14 < (this->super_StaticRenderTest).m_h) {
                local_aa8 = rengine::StaticRenderTest::pixel
                                      (&this->super_StaticRenderTest,0x6e,0x14);
                rengine::vec4::vec4(&local_ab8,0.0,0.0,0.64,1.0);
                bVar1 = rengine::fuzzy_equals(local_aa8,local_ab8,0.01);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
                  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x6e);
                  poVar2 = std::operator<<(poVar2,",");
                  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x14);
                  poVar2 = std::operator<<(poVar2,")=");
                  poVar4 = (ostream *)0x6e;
                  local_ac8 = rengine::StaticRenderTest::pixel
                                        (&this->super_StaticRenderTest,0x6e,0x14);
                  poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_ac8);
                  pcVar5 = "; expected=";
                  poVar2 = std::operator<<(poVar2,"; expected=");
                  rengine::vec4::vec4(&local_ad8,0.0,0.0,0.64,1.0);
                  poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_ad8);
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                ,0xce,"virtual void OpacityTextures::check()");
                }
                if ((this->super_StaticRenderTest).m_w < 0x6f) {
                  __assert_fail("110 < m_w",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                ,0xcf,"virtual void OpacityTextures::check()");
                }
                if ((this->super_StaticRenderTest).m_h < 0xb) {
                  __assert_fail("10 < m_h",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                ,0xcf,"virtual void OpacityTextures::check()");
                }
                local_ae8 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6e,10);
                rengine::vec4::vec4(&local_af8,0.0,0.0,0.0,1.0);
                bVar1 = rengine::fuzzy_equals(local_ae8,local_af8,0.01);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  if ((this->super_StaticRenderTest).m_w < 0x65) {
                    __assert_fail("100 < m_w",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                  ,0xd0,"virtual void OpacityTextures::check()");
                  }
                  if (0x14 < (this->super_StaticRenderTest).m_h) {
                    local_b28 = rengine::StaticRenderTest::pixel
                                          (&this->super_StaticRenderTest,100,0x14);
                    rengine::vec4::vec4(&local_b38,0.0,0.0,0.0,1.0);
                    bVar1 = rengine::fuzzy_equals(local_b28,local_b38,0.01);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      return;
                    }
                    poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
                    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,100);
                    poVar2 = std::operator<<(poVar2,",");
                    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x14);
                    poVar2 = std::operator<<(poVar2,")=");
                    poVar4 = (ostream *)0x64;
                    local_b48 = rengine::StaticRenderTest::pixel
                                          (&this->super_StaticRenderTest,100,0x14);
                    poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_b48);
                    pcVar5 = "; expected=";
                    poVar2 = std::operator<<(poVar2,"; expected=");
                    rengine::vec4::vec4(&local_b58,0.0,0.0,0.0,1.0);
                    poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_b58);
                    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                  ,0xd0,"virtual void OpacityTextures::check()");
                  }
                  __assert_fail("20 < m_h",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                ,0xd0,"virtual void OpacityTextures::check()");
                }
                poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
                poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x6e);
                poVar2 = std::operator<<(poVar2,",");
                poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
                poVar2 = std::operator<<(poVar2,")=");
                poVar4 = (ostream *)0x6e;
                local_b08 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6e,10);
                poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_b08);
                pcVar5 = "; expected=";
                poVar2 = std::operator<<(poVar2,"; expected=");
                rengine::vec4::vec4(&local_b18,0.0,0.0,0.0,1.0);
                poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_b18);
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                              ,0xcf,"virtual void OpacityTextures::check()");
              }
              __assert_fail("20 < m_h",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xce,"virtual void OpacityTextures::check()");
            }
            if (local_7c4 - 1.0 < 0.0) {
              __assert_fail("x1-1 >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcb,"virtual void OpacityTextures::check()");
            }
            if ((float)(this->super_StaticRenderTest).m_w <= local_7c4 - 1.0) {
              __assert_fail("x1-1 < m_w",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcb,"virtual void OpacityTextures::check()");
            }
            if (local_998 < 0.0) {
              __assert_fail("y >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcb,"virtual void OpacityTextures::check()");
            }
            if ((float)(this->super_StaticRenderTest).m_h <= local_998) {
              __assert_fail("y < m_h",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcb,"virtual void OpacityTextures::check()");
            }
            local_9a8 = rengine::StaticRenderTest::pixel
                                  (&this->super_StaticRenderTest,(int)(local_7c4 - 1.0),
                                   (int)local_998);
            rengine::vec4::vec4(&local_9b8,0.0,0.0,0.0,1.0);
            bVar1 = rengine::fuzzy_equals(local_9a8,local_9b8,0.01);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
              pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
              poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_7c4 - 1.0);
              poVar2 = std::operator<<(poVar2,",");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_998);
              poVar2 = std::operator<<(poVar2,")=");
              poVar4 = (ostream *)(ulong)(uint)(int)(local_7c4 - 1.0);
              local_9c8 = rengine::StaticRenderTest::pixel
                                    (&this->super_StaticRenderTest,(int)(local_7c4 - 1.0),
                                     (int)local_998);
              poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_9c8);
              pcVar5 = "; expected=";
              poVar2 = std::operator<<(poVar2,"; expected=");
              rengine::vec4::vec4(&local_9d8,0.0,0.0,0.0,1.0);
              poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_9d8);
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcb,"virtual void OpacityTextures::check()");
            }
            if (local_7d8 + 1.0 < 0.0) {
              __assert_fail("x2+1 >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcb,"virtual void OpacityTextures::check()");
            }
            if ((float)(this->super_StaticRenderTest).m_w <= local_7d8 + 1.0) {
              __assert_fail("x2+1 < m_w",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcb,"virtual void OpacityTextures::check()");
            }
            if (local_998 < 0.0) break;
            if ((float)(this->super_StaticRenderTest).m_h <= local_998) {
              __assert_fail("y < m_h",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcb,"virtual void OpacityTextures::check()");
            }
            local_9e8 = rengine::StaticRenderTest::pixel
                                  (&this->super_StaticRenderTest,(int)(local_7d8 + 1.0),
                                   (int)local_998);
            rengine::vec4::vec4(&local_9f8,0.0,0.0,0.0,1.0);
            bVar1 = rengine::fuzzy_equals(local_9e8,local_9f8,0.01);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
              pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
              poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_7d8 + 1.0);
              poVar2 = std::operator<<(poVar2,",");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_998);
              poVar2 = std::operator<<(poVar2,")=");
              poVar4 = (ostream *)(ulong)(uint)(int)(local_7d8 + 1.0);
              local_a08 = rengine::StaticRenderTest::pixel
                                    (&this->super_StaticRenderTest,(int)(local_7d8 + 1.0),
                                     (int)local_998);
              poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_a08);
              pcVar5 = "; expected=";
              poVar2 = std::operator<<(poVar2,"; expected=");
              rengine::vec4::vec4(&local_a18,0.0,0.0,0.0,1.0);
              poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_a18);
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcb,"virtual void OpacityTextures::check()");
            }
            local_998 = local_998 + 1.0;
          }
          __assert_fail("y >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        if (local_914 < 0.0) {
          __assert_fail("x >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        if ((float)(this->super_StaticRenderTest).m_w <= local_914) {
          __assert_fail("x < m_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        if (local_7ec - 1.0 < 0.0) {
          __assert_fail("y1-1 >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        if ((float)(this->super_StaticRenderTest).m_h <= local_7ec - 1.0) {
          __assert_fail("y1-1 < m_h",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        local_924 = rengine::StaticRenderTest::pixel
                              (&this->super_StaticRenderTest,(int)local_914,(int)(local_7ec - 1.0));
        rengine::vec4::vec4(&local_934,0.0,0.0,0.0,1.0);
        bVar1 = rengine::fuzzy_equals(local_924,local_934,0.01);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
          poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_914);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7ec - 1.0);
          poVar2 = std::operator<<(poVar2,")=");
          poVar4 = (ostream *)(ulong)(uint)(int)local_914;
          local_944 = rengine::StaticRenderTest::pixel
                                (&this->super_StaticRenderTest,(int)local_914,(int)(local_7ec - 1.0)
                                );
          poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_944);
          pcVar5 = "; expected=";
          poVar2 = std::operator<<(poVar2,"; expected=");
          rengine::vec4::vec4(&local_954,0.0,0.0,0.0,1.0);
          poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,local_954);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        if (local_914 < 0.0) {
          __assert_fail("x >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        if ((float)(this->super_StaticRenderTest).m_w <= local_914) {
          __assert_fail("x < m_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        if (local_800 + 1.0 < 0.0) break;
        if ((float)(this->super_StaticRenderTest).m_h <= local_800 + 1.0) {
          __assert_fail("y2+1 < m_h",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        local_964 = rengine::StaticRenderTest::pixel
                              (&this->super_StaticRenderTest,(int)local_914,(int)(local_800 + 1.0));
        rengine::vec4::vec4(&local_974,0.0,0.0,0.0,1.0);
        bVar1 = rengine::fuzzy_equals(local_964,local_974,0.01);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
          poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_914);
          poVar2 = std::operator<<(poVar2,",");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_800 + 1.0);
          poVar2 = std::operator<<(poVar2,")=");
          poVar4 = (ostream *)(ulong)(uint)(int)local_914;
          local_984 = rengine::StaticRenderTest::pixel
                                (&this->super_StaticRenderTest,(int)local_914,(int)(local_800 + 1.0)
                                );
          poVar2 = rengine::operator<<((rengine *)poVar2,poVar4,local_984);
          pcVar5 = "; expected=";
          poVar2 = std::operator<<(poVar2,"; expected=");
          rengine::vec4::vec4(&stack0xfffffffffffff66c,0.0,0.0,0.0,1.0);
          poVar2 = rengine::operator<<((rengine *)poVar2,(ostream *)pcVar5,vStack_994);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcb,"virtual void OpacityTextures::check()");
        }
        local_914 = local_914 + 1.0;
      }
      __assert_fail("y2+1 >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                    ,0xcb,"virtual void OpacityTextures::check()");
    }
    __assert_fail("y2+1 < m_h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xcb,"virtual void OpacityTextures::check()");
  }
  __assert_fail("32 < m_w",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,0xc9,"virtual void OpacityTextures::check()");
}

Assistant:

void check() override {
        check_pixelsOutside(rect2d::fromXywh(10, 10, 11, 11), vec4(0, 0, 0, 1));
        check_pixel(10, 10, vec4(0.5, 0, 0, 1));
        check_pixel(11, 10, vec4(0.5, 0, 0, 1));
        check_pixel(10, 11, vec4(0.5, 0, 0, 1));
        check_pixel(11, 11, vec4(0, 0, 0.5, 1));
        check_pixel(11, 12, vec4(0, 0, 0.5, 1));
        check_pixel(12, 11, vec4(0, 0, 0.5, 1));

        check_pixelsOutside(rect2d::fromXywh(31, 11, 11, 11), vec4(0, 0, 0, 1));
        check_pixel(31, 11, vec4(0, 0.5, 0, 1));
        check_pixel(32, 11, vec4(0, 0.5, 0, 1));
        check_pixel(31, 12, vec4(0, 0.5, 0, 1));
        check_pixel(32, 12, vec4(0.5, 0, 0, 1));
        check_pixel(33, 12, vec4(0.5, 0, 0, 1));
        check_pixel(32, 13, vec4(0.5, 0, 0, 1));

        check_pixelsOutside(rect2d::fromXywh(100, 10, 11, 11), vec4(0, 0, 0, 1));
        check_pixel(100, 10, vec4(0.64, 0, 0, 1));
        check_pixel(101, 11, vec4(0, 0, 0.64, 1));
        check_pixel(110, 20, vec4(0, 0, 0.64, 1));
        check_pixel(110, 10, vec4(0, 0, 0, 1));
        check_pixel(100, 20, vec4(0, 0, 0, 1));
    }